

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O2

void __thiscall diff_match_patch_test::testDiffMain(diff_match_patch_test *this)

{
  clock_t cVar1;
  clock_t cVar2;
  int iVar3;
  diff_match_patch_test *pdVar4;
  wstring *pwVar5;
  wstring *this_00;
  bool bVar6;
  allocator<wchar_t> local_179a;
  allocator<wchar_t> local_1799;
  allocator<wchar_t> local_1798;
  allocator<wchar_t> local_1797;
  allocator<wchar_t> local_1796;
  allocator<wchar_t> local_1795;
  allocator<wchar_t> local_1794;
  allocator<wchar_t> local_1793;
  allocator<wchar_t> local_1792;
  allocator<wchar_t> local_1791;
  wstring b;
  wstring a;
  wstring local_1748;
  undefined1 *local_1728 [2];
  undefined1 local_1718 [16];
  wstring local_1708 [32];
  wstring local_16e8 [32];
  wstring local_16c8 [32];
  wstring local_16a8 [32];
  allocator<wchar_t> local_1688 [32];
  deque<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  texts_textmode;
  deque<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  texts_linemode;
  deque<Diff,_std::allocator<Diff>_> diffs;
  undefined1 local_1570 [40];
  undefined1 local_1548 [40];
  undefined1 local_1520 [40];
  undefined1 local_14f8 [40];
  undefined1 local_14d0 [40];
  undefined1 local_14a8 [40];
  undefined1 local_1480 [40];
  undefined1 local_1458 [40];
  undefined1 local_1430 [40];
  undefined1 local_1408 [40];
  undefined1 local_13e0 [40];
  undefined1 local_13b8 [40];
  undefined1 local_1390 [40];
  undefined1 local_1368 [40];
  undefined1 local_1340 [40];
  undefined1 local_1318 [40];
  undefined1 local_12f0 [40];
  undefined1 local_12c8 [40];
  undefined1 local_12a0 [40];
  undefined1 local_1278 [40];
  undefined1 local_1250 [40];
  undefined1 local_1228 [40];
  undefined1 local_1200 [40];
  undefined1 local_11d8 [40];
  undefined1 local_11b0 [40];
  undefined1 local_1188 [40];
  undefined1 local_1160 [40];
  undefined1 local_1138 [40];
  undefined1 local_1110 [40];
  undefined1 local_10e8 [40];
  undefined1 local_10c0 [40];
  undefined1 local_1098 [40];
  undefined1 local_1070 [40];
  undefined1 local_1048 [40];
  undefined1 local_1020 [40];
  undefined1 local_ff8 [40];
  undefined1 local_fd0 [40];
  undefined1 local_fa8 [40];
  undefined1 local_f80 [40];
  undefined1 local_f58 [40];
  undefined1 local_f30 [40];
  undefined1 local_f08 [40];
  undefined1 local_ee0 [40];
  undefined1 local_eb8 [40];
  undefined1 local_e90 [40];
  undefined1 local_e68 [40];
  undefined1 local_e40 [40];
  undefined1 local_e18 [40];
  undefined1 local_df0 [40];
  undefined1 local_dc8 [40];
  undefined1 local_da0 [40];
  undefined1 local_d78 [40];
  undefined1 local_d50 [40];
  undefined1 local_d28 [40];
  undefined1 local_d00 [40];
  undefined1 local_cd8 [40];
  undefined1 local_cb0 [40];
  undefined1 local_c88 [40];
  undefined1 local_c60 [40];
  undefined1 local_c38 [40];
  undefined1 local_c10 [40];
  undefined1 local_be8 [40];
  undefined1 local_bc0 [40];
  undefined1 local_b98 [40];
  undefined1 local_b70 [40];
  undefined1 local_b48 [40];
  undefined1 local_b20 [40];
  undefined1 local_af8 [40];
  undefined1 local_ad0 [40];
  undefined1 local_aa8 [40];
  undefined1 local_a80 [40];
  undefined1 local_a58 [40];
  undefined1 local_a30 [40];
  undefined1 local_a08 [40];
  undefined1 local_9e0 [40];
  undefined1 local_9b8 [40];
  undefined1 local_990 [40];
  undefined1 local_968 [40];
  undefined1 local_940 [40];
  undefined1 local_918 [40];
  undefined1 local_8f0 [40];
  undefined1 local_8c8 [40];
  undefined1 local_8a0 [40];
  undefined1 local_878 [40];
  undefined1 local_850 [40];
  undefined1 local_828 [40];
  undefined1 local_800 [40];
  undefined1 local_7d8 [40];
  undefined1 local_7b0 [40];
  undefined1 local_788 [40];
  undefined1 local_760 [40];
  undefined1 local_738 [40];
  undefined1 local_710 [40];
  undefined1 local_6e8 [40];
  undefined1 local_6c0 [40];
  undefined1 local_698 [40];
  undefined1 local_670 [40];
  undefined1 local_648 [40];
  undefined1 local_620 [40];
  undefined1 local_5f8 [40];
  undefined1 local_5d0 [40];
  undefined1 local_5a8 [40];
  undefined1 local_580 [40];
  undefined1 local_558 [40];
  undefined1 local_530 [40];
  undefined1 local_508 [40];
  undefined1 local_4e0 [40];
  undefined1 local_4b8 [40];
  undefined1 local_490 [40];
  undefined1 local_468 [40];
  undefined1 local_440 [40];
  undefined1 local_418 [40];
  undefined1 local_3f0 [40];
  undefined1 local_3c8 [40];
  undefined1 local_3a0 [40];
  undefined1 local_378 [40];
  undefined1 local_350 [40];
  undefined1 local_328 [40];
  undefined1 local_300 [40];
  undefined1 local_2d8 [40];
  undefined1 local_2b0 [40];
  undefined1 local_288 [40];
  undefined1 local_260 [40];
  undefined1 local_238 [40];
  undefined1 local_210 [40];
  undefined1 local_1e8 [40];
  undefined1 local_1c0 [40];
  undefined1 local_198 [40];
  undefined1 local_170 [40];
  undefined1 local_148 [40];
  deque<Diff,_std::allocator<Diff>_> local_120;
  deque<Diff,_std::allocator<Diff>_> local_d0;
  deque<Diff,_std::allocator<Diff>_> local_80;
  
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&texts_linemode,L"",local_1688)
  ;
  Diff::Diff((Diff *)local_d78,Insert,(wstring *)&texts_linemode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&texts_textmode,L"",&local_1793);
  Diff::Diff((Diff *)local_da0,Insert,(wstring *)&texts_textmode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&a,L"",&local_1794);
  Diff::Diff((Diff *)local_dc8,Insert,(wstring *)&a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&b,L"",&local_1795);
  Diff::Diff((Diff *)local_df0,Insert,(wstring *)&b);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&local_1748,L"",&local_1796);
  Diff::Diff((Diff *)local_148,Insert,(wstring *)&local_1748);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)local_1728,L"",&local_1797);
  Diff::Diff((Diff *)local_170,Insert,(wstring *)local_1728);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1708,L"",&local_1798);
  Diff::Diff((Diff *)local_198,Insert,local_1708);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16a8,L"",&local_1799);
  Diff::Diff((Diff *)local_1c0,Insert,local_16a8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16c8,L"",&local_179a);
  Diff::Diff((Diff *)local_1e8,Insert,local_16c8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16e8,L"",&local_1792);
  pdVar4 = (diff_match_patch_test *)0x1;
  Diff::Diff((Diff *)local_210,Insert,local_16e8);
  diffList(&diffs,pdVar4,(Diff *)local_d78,(Diff *)local_da0,(Diff *)local_dc8,(Diff *)local_df0,
           (Diff *)local_148,(Diff *)local_170,(Diff *)local_198,(Diff *)local_1c0,(Diff *)local_1e8
           ,(Diff *)local_210);
  std::__cxx11::wstring::~wstring((wstring *)(local_210 + 8));
  std::__cxx11::wstring::~wstring(local_16e8);
  std::__cxx11::wstring::~wstring((wstring *)(local_1e8 + 8));
  std::__cxx11::wstring::~wstring(local_16c8);
  std::__cxx11::wstring::~wstring((wstring *)(local_1c0 + 8));
  std::__cxx11::wstring::~wstring(local_16a8);
  std::__cxx11::wstring::~wstring((wstring *)(local_198 + 8));
  std::__cxx11::wstring::~wstring(local_1708);
  std::__cxx11::wstring::~wstring((wstring *)(local_170 + 8));
  std::__cxx11::wstring::~wstring((wstring *)local_1728);
  std::__cxx11::wstring::~wstring((wstring *)(local_148 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&local_1748);
  std::__cxx11::wstring::~wstring((wstring *)(local_df0 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&b);
  std::__cxx11::wstring::~wstring((wstring *)(local_dc8 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&a);
  std::__cxx11::wstring::~wstring((wstring *)(local_da0 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&texts_textmode);
  std::__cxx11::wstring::~wstring((wstring *)(local_d78 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&texts_linemode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&texts_textmode,L"diff_main: Null case.",(allocator<wchar_t> *)&local_1748);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&a,L"",(allocator<wchar_t> *)local_1728);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&b,L"",(allocator<wchar_t> *)local_1708);
  pwVar5 = (wstring *)&texts_linemode;
  diff_match_patch::diff_main(pwVar5,(wstring *)this,SUB81(&a,0));
  assertEquals((diff_match_patch_test *)pwVar5,(wstring *)&texts_textmode,&diffs,
               (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::__cxx11::wstring::~wstring((wstring *)&b);
  std::__cxx11::wstring::~wstring((wstring *)&a);
  std::__cxx11::wstring::~wstring((wstring *)&texts_textmode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&texts_textmode,L"abc",&local_1793);
  Diff::Diff((Diff *)local_e18,Equal,(wstring *)&texts_textmode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&a,L"",&local_1794);
  Diff::Diff((Diff *)local_e40,Insert,(wstring *)&a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&b,L"",&local_1795);
  Diff::Diff((Diff *)local_e68,Insert,(wstring *)&b);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&local_1748,L"",&local_1796);
  Diff::Diff((Diff *)local_e90,Insert,(wstring *)&local_1748);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)local_1728,L"",&local_1797);
  Diff::Diff((Diff *)local_238,Insert,(wstring *)local_1728);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1708,L"",&local_1798);
  Diff::Diff((Diff *)local_260,Insert,local_1708);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16a8,L"",&local_1799);
  Diff::Diff((Diff *)local_288,Insert,local_16a8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16c8,L"",&local_179a);
  Diff::Diff((Diff *)local_2b0,Insert,local_16c8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16e8,L"",&local_1792);
  Diff::Diff((Diff *)local_2d8,Insert,local_16e8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)local_1688,L"",&local_1791);
  pdVar4 = (diff_match_patch_test *)0x1;
  Diff::Diff((Diff *)local_300,Insert,(wstring *)local_1688);
  diffList((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode,pdVar4,(Diff *)local_e18,
           (Diff *)local_e40,(Diff *)local_e68,(Diff *)local_e90,(Diff *)local_238,(Diff *)local_260
           ,(Diff *)local_288,(Diff *)local_2b0,(Diff *)local_2d8,(Diff *)local_300);
  std::deque<Diff,_std::allocator<Diff>_>::_M_move_assign1
            (&diffs,(deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::__cxx11::wstring::~wstring((wstring *)(local_300 + 8));
  std::__cxx11::wstring::~wstring((wstring *)local_1688);
  std::__cxx11::wstring::~wstring((wstring *)(local_2d8 + 8));
  std::__cxx11::wstring::~wstring(local_16e8);
  std::__cxx11::wstring::~wstring((wstring *)(local_2b0 + 8));
  std::__cxx11::wstring::~wstring(local_16c8);
  std::__cxx11::wstring::~wstring((wstring *)(local_288 + 8));
  std::__cxx11::wstring::~wstring(local_16a8);
  std::__cxx11::wstring::~wstring((wstring *)(local_260 + 8));
  std::__cxx11::wstring::~wstring(local_1708);
  std::__cxx11::wstring::~wstring((wstring *)(local_238 + 8));
  std::__cxx11::wstring::~wstring((wstring *)local_1728);
  std::__cxx11::wstring::~wstring((wstring *)(local_e90 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&local_1748);
  std::__cxx11::wstring::~wstring((wstring *)(local_e68 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&b);
  std::__cxx11::wstring::~wstring((wstring *)(local_e40 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&a);
  std::__cxx11::wstring::~wstring((wstring *)(local_e18 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&texts_textmode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&texts_textmode,L"diff_main: Equality.",(allocator<wchar_t> *)&local_1748);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&a,L"abc",(allocator<wchar_t> *)local_1728);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&b,L"abc",(allocator<wchar_t> *)local_1708);
  pwVar5 = (wstring *)&texts_linemode;
  diff_match_patch::diff_main(pwVar5,(wstring *)this,SUB81(&a,0));
  assertEquals((diff_match_patch_test *)pwVar5,(wstring *)&texts_textmode,&diffs,
               (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::__cxx11::wstring::~wstring((wstring *)&b);
  std::__cxx11::wstring::~wstring((wstring *)&a);
  std::__cxx11::wstring::~wstring((wstring *)&texts_textmode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&texts_textmode,L"ab",&local_1793);
  Diff::Diff((Diff *)local_eb8,Equal,(wstring *)&texts_textmode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&a,L"123",&local_1794);
  Diff::Diff((Diff *)local_ee0,Insert,(wstring *)&a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&b,L"c",&local_1795);
  Diff::Diff((Diff *)local_f08,Equal,(wstring *)&b);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&local_1748,L"",&local_1796);
  Diff::Diff((Diff *)local_f30,Insert,(wstring *)&local_1748);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)local_1728,L"",&local_1797);
  Diff::Diff((Diff *)local_328,Insert,(wstring *)local_1728);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1708,L"",&local_1798);
  Diff::Diff((Diff *)local_350,Insert,local_1708);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16a8,L"",&local_1799);
  Diff::Diff((Diff *)local_378,Insert,local_16a8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16c8,L"",&local_179a);
  Diff::Diff((Diff *)local_3a0,Insert,local_16c8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16e8,L"",&local_1792);
  Diff::Diff((Diff *)local_3c8,Insert,local_16e8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)local_1688,L"",&local_1791);
  pdVar4 = (diff_match_patch_test *)0x1;
  Diff::Diff((Diff *)local_3f0,Insert,(wstring *)local_1688);
  diffList((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode,pdVar4,(Diff *)local_eb8,
           (Diff *)local_ee0,(Diff *)local_f08,(Diff *)local_f30,(Diff *)local_328,(Diff *)local_350
           ,(Diff *)local_378,(Diff *)local_3a0,(Diff *)local_3c8,(Diff *)local_3f0);
  std::deque<Diff,_std::allocator<Diff>_>::_M_move_assign1
            (&diffs,(deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::__cxx11::wstring::~wstring((wstring *)(local_3f0 + 8));
  std::__cxx11::wstring::~wstring((wstring *)local_1688);
  std::__cxx11::wstring::~wstring((wstring *)(local_3c8 + 8));
  std::__cxx11::wstring::~wstring(local_16e8);
  std::__cxx11::wstring::~wstring((wstring *)(local_3a0 + 8));
  std::__cxx11::wstring::~wstring(local_16c8);
  std::__cxx11::wstring::~wstring((wstring *)(local_378 + 8));
  std::__cxx11::wstring::~wstring(local_16a8);
  std::__cxx11::wstring::~wstring((wstring *)(local_350 + 8));
  std::__cxx11::wstring::~wstring(local_1708);
  std::__cxx11::wstring::~wstring((wstring *)(local_328 + 8));
  std::__cxx11::wstring::~wstring((wstring *)local_1728);
  std::__cxx11::wstring::~wstring((wstring *)(local_f30 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&local_1748);
  std::__cxx11::wstring::~wstring((wstring *)(local_f08 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&b);
  std::__cxx11::wstring::~wstring((wstring *)(local_ee0 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&a);
  std::__cxx11::wstring::~wstring((wstring *)(local_eb8 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&texts_textmode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&texts_textmode,L"diff_main: Simple insertion.",
             (allocator<wchar_t> *)&local_1748);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&a,L"abc",(allocator<wchar_t> *)local_1728);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&b,L"ab123c",(allocator<wchar_t> *)local_1708);
  pwVar5 = (wstring *)&texts_linemode;
  diff_match_patch::diff_main(pwVar5,(wstring *)this,SUB81(&a,0));
  assertEquals((diff_match_patch_test *)pwVar5,(wstring *)&texts_textmode,&diffs,
               (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::__cxx11::wstring::~wstring((wstring *)&b);
  std::__cxx11::wstring::~wstring((wstring *)&a);
  std::__cxx11::wstring::~wstring((wstring *)&texts_textmode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&texts_textmode,L"a",&local_1793);
  Diff::Diff((Diff *)local_f58,Equal,(wstring *)&texts_textmode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&a,L"123",&local_1794);
  Diff::Diff((Diff *)local_f80,Delete,(wstring *)&a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&b,L"bc",&local_1795);
  Diff::Diff((Diff *)local_fa8,Equal,(wstring *)&b);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&local_1748,L"",&local_1796);
  Diff::Diff((Diff *)local_fd0,Insert,(wstring *)&local_1748);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)local_1728,L"",&local_1797);
  Diff::Diff((Diff *)local_418,Insert,(wstring *)local_1728);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1708,L"",&local_1798);
  Diff::Diff((Diff *)local_440,Insert,local_1708);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16a8,L"",&local_1799);
  Diff::Diff((Diff *)local_468,Insert,local_16a8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16c8,L"",&local_179a);
  Diff::Diff((Diff *)local_490,Insert,local_16c8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16e8,L"",&local_1792);
  Diff::Diff((Diff *)local_4b8,Insert,local_16e8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)local_1688,L"",&local_1791);
  pdVar4 = (diff_match_patch_test *)0x1;
  Diff::Diff((Diff *)local_4e0,Insert,(wstring *)local_1688);
  diffList((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode,pdVar4,(Diff *)local_f58,
           (Diff *)local_f80,(Diff *)local_fa8,(Diff *)local_fd0,(Diff *)local_418,(Diff *)local_440
           ,(Diff *)local_468,(Diff *)local_490,(Diff *)local_4b8,(Diff *)local_4e0);
  std::deque<Diff,_std::allocator<Diff>_>::_M_move_assign1
            (&diffs,(deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::__cxx11::wstring::~wstring((wstring *)(local_4e0 + 8));
  std::__cxx11::wstring::~wstring((wstring *)local_1688);
  std::__cxx11::wstring::~wstring((wstring *)(local_4b8 + 8));
  std::__cxx11::wstring::~wstring(local_16e8);
  std::__cxx11::wstring::~wstring((wstring *)(local_490 + 8));
  std::__cxx11::wstring::~wstring(local_16c8);
  std::__cxx11::wstring::~wstring((wstring *)(local_468 + 8));
  std::__cxx11::wstring::~wstring(local_16a8);
  std::__cxx11::wstring::~wstring((wstring *)(local_440 + 8));
  std::__cxx11::wstring::~wstring(local_1708);
  std::__cxx11::wstring::~wstring((wstring *)(local_418 + 8));
  std::__cxx11::wstring::~wstring((wstring *)local_1728);
  std::__cxx11::wstring::~wstring((wstring *)(local_fd0 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&local_1748);
  std::__cxx11::wstring::~wstring((wstring *)(local_fa8 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&b);
  std::__cxx11::wstring::~wstring((wstring *)(local_f80 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&a);
  std::__cxx11::wstring::~wstring((wstring *)(local_f58 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&texts_textmode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&texts_textmode,L"diff_main: Simple deletion.",
             (allocator<wchar_t> *)&local_1748);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&a,L"a123bc",(allocator<wchar_t> *)local_1728);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&b,L"abc",(allocator<wchar_t> *)local_1708);
  pwVar5 = (wstring *)&texts_linemode;
  diff_match_patch::diff_main(pwVar5,(wstring *)this,SUB81(&a,0));
  assertEquals((diff_match_patch_test *)pwVar5,(wstring *)&texts_textmode,&diffs,
               (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::__cxx11::wstring::~wstring((wstring *)&b);
  std::__cxx11::wstring::~wstring((wstring *)&a);
  std::__cxx11::wstring::~wstring((wstring *)&texts_textmode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&texts_textmode,L"a",&local_1793);
  Diff::Diff((Diff *)local_ff8,Equal,(wstring *)&texts_textmode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&a,L"123",&local_1794);
  Diff::Diff((Diff *)local_1020,Insert,(wstring *)&a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&b,L"b",&local_1795);
  Diff::Diff((Diff *)local_1048,Equal,(wstring *)&b);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&local_1748,L"456",&local_1796)
  ;
  Diff::Diff((Diff *)local_1070,Insert,(wstring *)&local_1748);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)local_1728,L"c",&local_1797);
  Diff::Diff((Diff *)local_508,Equal,(wstring *)local_1728);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1708,L"",&local_1798);
  Diff::Diff((Diff *)local_530,Insert,local_1708);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16a8,L"",&local_1799);
  Diff::Diff((Diff *)local_558,Insert,local_16a8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16c8,L"",&local_179a);
  Diff::Diff((Diff *)local_580,Insert,local_16c8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16e8,L"",&local_1792);
  Diff::Diff((Diff *)local_5a8,Insert,local_16e8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)local_1688,L"",&local_1791);
  pdVar4 = (diff_match_patch_test *)0x1;
  Diff::Diff((Diff *)local_5d0,Insert,(wstring *)local_1688);
  diffList((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode,pdVar4,(Diff *)local_ff8,
           (Diff *)local_1020,(Diff *)local_1048,(Diff *)local_1070,(Diff *)local_508,
           (Diff *)local_530,(Diff *)local_558,(Diff *)local_580,(Diff *)local_5a8,(Diff *)local_5d0
          );
  std::deque<Diff,_std::allocator<Diff>_>::_M_move_assign1
            (&diffs,(deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::__cxx11::wstring::~wstring((wstring *)(local_5d0 + 8));
  std::__cxx11::wstring::~wstring((wstring *)local_1688);
  std::__cxx11::wstring::~wstring((wstring *)(local_5a8 + 8));
  std::__cxx11::wstring::~wstring(local_16e8);
  std::__cxx11::wstring::~wstring((wstring *)(local_580 + 8));
  std::__cxx11::wstring::~wstring(local_16c8);
  std::__cxx11::wstring::~wstring((wstring *)(local_558 + 8));
  std::__cxx11::wstring::~wstring(local_16a8);
  std::__cxx11::wstring::~wstring((wstring *)(local_530 + 8));
  std::__cxx11::wstring::~wstring(local_1708);
  std::__cxx11::wstring::~wstring((wstring *)(local_508 + 8));
  std::__cxx11::wstring::~wstring((wstring *)local_1728);
  std::__cxx11::wstring::~wstring((wstring *)(local_1070 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&local_1748);
  std::__cxx11::wstring::~wstring((wstring *)(local_1048 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&b);
  std::__cxx11::wstring::~wstring((wstring *)(local_1020 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&a);
  std::__cxx11::wstring::~wstring((wstring *)(local_ff8 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&texts_textmode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&texts_textmode,L"diff_main: Two insertions.",
             (allocator<wchar_t> *)&local_1748);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&a,L"abc",(allocator<wchar_t> *)local_1728);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&b,L"a123b456c",(allocator<wchar_t> *)local_1708);
  pwVar5 = (wstring *)&texts_linemode;
  diff_match_patch::diff_main(pwVar5,(wstring *)this,SUB81(&a,0));
  assertEquals((diff_match_patch_test *)pwVar5,(wstring *)&texts_textmode,&diffs,
               (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::__cxx11::wstring::~wstring((wstring *)&b);
  std::__cxx11::wstring::~wstring((wstring *)&a);
  std::__cxx11::wstring::~wstring((wstring *)&texts_textmode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&texts_textmode,L"a",&local_1793);
  Diff::Diff((Diff *)local_1098,Equal,(wstring *)&texts_textmode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&a,L"123",&local_1794);
  Diff::Diff((Diff *)local_10c0,Delete,(wstring *)&a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&b,L"b",&local_1795);
  Diff::Diff((Diff *)local_10e8,Equal,(wstring *)&b);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&local_1748,L"456",&local_1796)
  ;
  Diff::Diff((Diff *)local_1110,Delete,(wstring *)&local_1748);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)local_1728,L"c",&local_1797);
  Diff::Diff((Diff *)local_5f8,Equal,(wstring *)local_1728);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1708,L"",&local_1798);
  Diff::Diff((Diff *)local_620,Insert,local_1708);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16a8,L"",&local_1799);
  Diff::Diff((Diff *)local_648,Insert,local_16a8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16c8,L"",&local_179a);
  Diff::Diff((Diff *)local_670,Insert,local_16c8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16e8,L"",&local_1792);
  Diff::Diff((Diff *)local_698,Insert,local_16e8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)local_1688,L"",&local_1791);
  pdVar4 = (diff_match_patch_test *)0x1;
  Diff::Diff((Diff *)local_6c0,Insert,(wstring *)local_1688);
  diffList((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode,pdVar4,(Diff *)local_1098,
           (Diff *)local_10c0,(Diff *)local_10e8,(Diff *)local_1110,(Diff *)local_5f8,
           (Diff *)local_620,(Diff *)local_648,(Diff *)local_670,(Diff *)local_698,(Diff *)local_6c0
          );
  std::deque<Diff,_std::allocator<Diff>_>::_M_move_assign1
            (&diffs,(deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::__cxx11::wstring::~wstring((wstring *)(local_6c0 + 8));
  std::__cxx11::wstring::~wstring((wstring *)local_1688);
  std::__cxx11::wstring::~wstring((wstring *)(local_698 + 8));
  std::__cxx11::wstring::~wstring(local_16e8);
  std::__cxx11::wstring::~wstring((wstring *)(local_670 + 8));
  std::__cxx11::wstring::~wstring(local_16c8);
  std::__cxx11::wstring::~wstring((wstring *)(local_648 + 8));
  std::__cxx11::wstring::~wstring(local_16a8);
  std::__cxx11::wstring::~wstring((wstring *)(local_620 + 8));
  std::__cxx11::wstring::~wstring(local_1708);
  std::__cxx11::wstring::~wstring((wstring *)(local_5f8 + 8));
  std::__cxx11::wstring::~wstring((wstring *)local_1728);
  std::__cxx11::wstring::~wstring((wstring *)(local_1110 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&local_1748);
  std::__cxx11::wstring::~wstring((wstring *)(local_10e8 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&b);
  std::__cxx11::wstring::~wstring((wstring *)(local_10c0 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&a);
  std::__cxx11::wstring::~wstring((wstring *)(local_1098 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&texts_textmode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&texts_textmode,L"diff_main: Two deletions.",
             (allocator<wchar_t> *)&local_1748);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&a,L"a123b456c",(allocator<wchar_t> *)local_1728);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&b,L"abc",(allocator<wchar_t> *)local_1708);
  pwVar5 = (wstring *)&texts_linemode;
  diff_match_patch::diff_main(pwVar5,(wstring *)this,SUB81(&a,0));
  assertEquals((diff_match_patch_test *)pwVar5,(wstring *)&texts_textmode,&diffs,
               (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::__cxx11::wstring::~wstring((wstring *)&b);
  std::__cxx11::wstring::~wstring((wstring *)&a);
  std::__cxx11::wstring::~wstring((wstring *)&texts_textmode);
  *(undefined4 *)this = 0;
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&texts_textmode,L"a",&local_1793);
  Diff::Diff((Diff *)local_1138,Delete,(wstring *)&texts_textmode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&a,L"b",&local_1794);
  Diff::Diff((Diff *)local_1160,Insert,(wstring *)&a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&b,L"",&local_1795);
  Diff::Diff((Diff *)local_1188,Insert,(wstring *)&b);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&local_1748,L"",&local_1796);
  Diff::Diff((Diff *)local_11b0,Insert,(wstring *)&local_1748);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)local_1728,L"",&local_1797);
  Diff::Diff((Diff *)local_6e8,Insert,(wstring *)local_1728);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1708,L"",&local_1798);
  Diff::Diff((Diff *)local_710,Insert,local_1708);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16a8,L"",&local_1799);
  Diff::Diff((Diff *)local_738,Insert,local_16a8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16c8,L"",&local_179a);
  Diff::Diff((Diff *)local_760,Insert,local_16c8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16e8,L"",&local_1792);
  Diff::Diff((Diff *)local_788,Insert,local_16e8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)local_1688,L"",&local_1791);
  pdVar4 = (diff_match_patch_test *)0x1;
  Diff::Diff((Diff *)local_7b0,Insert,(wstring *)local_1688);
  diffList((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode,pdVar4,(Diff *)local_1138,
           (Diff *)local_1160,(Diff *)local_1188,(Diff *)local_11b0,(Diff *)local_6e8,
           (Diff *)local_710,(Diff *)local_738,(Diff *)local_760,(Diff *)local_788,(Diff *)local_7b0
          );
  std::deque<Diff,_std::allocator<Diff>_>::_M_move_assign1
            (&diffs,(deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::__cxx11::wstring::~wstring((wstring *)(local_7b0 + 8));
  std::__cxx11::wstring::~wstring((wstring *)local_1688);
  std::__cxx11::wstring::~wstring((wstring *)(local_788 + 8));
  std::__cxx11::wstring::~wstring(local_16e8);
  std::__cxx11::wstring::~wstring((wstring *)(local_760 + 8));
  std::__cxx11::wstring::~wstring(local_16c8);
  std::__cxx11::wstring::~wstring((wstring *)(local_738 + 8));
  std::__cxx11::wstring::~wstring(local_16a8);
  std::__cxx11::wstring::~wstring((wstring *)(local_710 + 8));
  std::__cxx11::wstring::~wstring(local_1708);
  std::__cxx11::wstring::~wstring((wstring *)(local_6e8 + 8));
  std::__cxx11::wstring::~wstring((wstring *)local_1728);
  std::__cxx11::wstring::~wstring((wstring *)(local_11b0 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&local_1748);
  std::__cxx11::wstring::~wstring((wstring *)(local_1188 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&b);
  std::__cxx11::wstring::~wstring((wstring *)(local_1160 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&a);
  std::__cxx11::wstring::~wstring((wstring *)(local_1138 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&texts_textmode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&texts_textmode,L"diff_main: Simple case #1.",
             (allocator<wchar_t> *)&local_1748);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&a,L"a",(allocator<wchar_t> *)local_1728);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&b,L"b",(allocator<wchar_t> *)local_1708);
  pwVar5 = (wstring *)&texts_linemode;
  diff_match_patch::diff_main(pwVar5,(wstring *)this,SUB81(&a,0));
  assertEquals((diff_match_patch_test *)pwVar5,(wstring *)&texts_textmode,&diffs,
               (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::__cxx11::wstring::~wstring((wstring *)&b);
  std::__cxx11::wstring::~wstring((wstring *)&a);
  std::__cxx11::wstring::~wstring((wstring *)&texts_textmode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&texts_textmode,L"Apple",&local_1793);
  Diff::Diff((Diff *)local_11d8,Delete,(wstring *)&texts_textmode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&a,L"Banana",&local_1794);
  Diff::Diff((Diff *)local_1200,Insert,(wstring *)&a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&b,L"s are a",&local_1795);
  Diff::Diff((Diff *)local_1228,Equal,(wstring *)&b);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&local_1748,L"lso",&local_1796)
  ;
  Diff::Diff((Diff *)local_1250,Insert,(wstring *)&local_1748);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)local_1728,L" fruit.",&local_1797);
  Diff::Diff((Diff *)local_7d8,Equal,(wstring *)local_1728);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1708,L"",&local_1798);
  Diff::Diff((Diff *)local_800,Insert,local_1708);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16a8,L"",&local_1799);
  Diff::Diff((Diff *)local_828,Insert,local_16a8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16c8,L"",&local_179a);
  Diff::Diff((Diff *)local_850,Insert,local_16c8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16e8,L"",&local_1792);
  Diff::Diff((Diff *)local_878,Insert,local_16e8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)local_1688,L"",&local_1791);
  pdVar4 = (diff_match_patch_test *)0x1;
  Diff::Diff((Diff *)local_8a0,Insert,(wstring *)local_1688);
  diffList((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode,pdVar4,(Diff *)local_11d8,
           (Diff *)local_1200,(Diff *)local_1228,(Diff *)local_1250,(Diff *)local_7d8,
           (Diff *)local_800,(Diff *)local_828,(Diff *)local_850,(Diff *)local_878,(Diff *)local_8a0
          );
  std::deque<Diff,_std::allocator<Diff>_>::_M_move_assign1
            (&diffs,(deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::__cxx11::wstring::~wstring((wstring *)(local_8a0 + 8));
  std::__cxx11::wstring::~wstring((wstring *)local_1688);
  std::__cxx11::wstring::~wstring((wstring *)(local_878 + 8));
  std::__cxx11::wstring::~wstring(local_16e8);
  std::__cxx11::wstring::~wstring((wstring *)(local_850 + 8));
  std::__cxx11::wstring::~wstring(local_16c8);
  std::__cxx11::wstring::~wstring((wstring *)(local_828 + 8));
  std::__cxx11::wstring::~wstring(local_16a8);
  std::__cxx11::wstring::~wstring((wstring *)(local_800 + 8));
  std::__cxx11::wstring::~wstring(local_1708);
  std::__cxx11::wstring::~wstring((wstring *)(local_7d8 + 8));
  std::__cxx11::wstring::~wstring((wstring *)local_1728);
  std::__cxx11::wstring::~wstring((wstring *)(local_1250 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&local_1748);
  std::__cxx11::wstring::~wstring((wstring *)(local_1228 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&b);
  std::__cxx11::wstring::~wstring((wstring *)(local_1200 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&a);
  std::__cxx11::wstring::~wstring((wstring *)(local_11d8 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&texts_textmode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&texts_textmode,L"diff_main: Simple case #2.",
             (allocator<wchar_t> *)&local_1748);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&a,L"Apples are a fruit.",(allocator<wchar_t> *)local_1728);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&b,L"Bananas are also fruit.",(allocator<wchar_t> *)local_1708);
  pwVar5 = (wstring *)&texts_linemode;
  diff_match_patch::diff_main(pwVar5,(wstring *)this,SUB81(&a,0));
  assertEquals((diff_match_patch_test *)pwVar5,(wstring *)&texts_textmode,&diffs,
               (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::__cxx11::wstring::~wstring((wstring *)&b);
  std::__cxx11::wstring::~wstring((wstring *)&a);
  std::__cxx11::wstring::~wstring((wstring *)&texts_textmode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&texts_textmode,L"a",&local_1793);
  Diff::Diff((Diff *)local_1278,Delete,(wstring *)&texts_textmode);
  a._M_dataplus._M_p = (pointer)&a.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&a,L"ڀ",L"");
  Diff::Diff((Diff *)local_12a0,Insert,(wstring *)&a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&b,L"x",&local_1794);
  Diff::Diff((Diff *)local_12c8,Equal,(wstring *)&b);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&local_1748,L"\t",&local_1795);
  Diff::Diff((Diff *)local_12f0,Delete,(wstring *)&local_1748);
  local_1728[0] = local_1718;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1728,L"",L"");
  Diff::Diff((Diff *)local_8c8,Insert,(wstring *)local_1728);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1708,L"",&local_1796);
  Diff::Diff((Diff *)local_8f0,Insert,local_1708);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16a8,L"",&local_1797);
  Diff::Diff((Diff *)local_918,Insert,local_16a8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16c8,L"",&local_1798);
  Diff::Diff((Diff *)local_940,Insert,local_16c8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16e8,L"",&local_1799);
  Diff::Diff((Diff *)local_968,Insert,local_16e8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)local_1688,L"",&local_179a);
  pdVar4 = (diff_match_patch_test *)0x1;
  Diff::Diff((Diff *)local_990,Insert,(wstring *)local_1688);
  diffList((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode,pdVar4,(Diff *)local_1278,
           (Diff *)local_12a0,(Diff *)local_12c8,(Diff *)local_12f0,(Diff *)local_8c8,
           (Diff *)local_8f0,(Diff *)local_918,(Diff *)local_940,(Diff *)local_968,(Diff *)local_990
          );
  std::deque<Diff,_std::allocator<Diff>_>::_M_move_assign1
            (&diffs,(deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::__cxx11::wstring::~wstring((wstring *)(local_990 + 8));
  std::__cxx11::wstring::~wstring((wstring *)local_1688);
  std::__cxx11::wstring::~wstring((wstring *)(local_968 + 8));
  std::__cxx11::wstring::~wstring(local_16e8);
  std::__cxx11::wstring::~wstring((wstring *)(local_940 + 8));
  std::__cxx11::wstring::~wstring(local_16c8);
  std::__cxx11::wstring::~wstring((wstring *)(local_918 + 8));
  std::__cxx11::wstring::~wstring(local_16a8);
  std::__cxx11::wstring::~wstring((wstring *)(local_8f0 + 8));
  std::__cxx11::wstring::~wstring(local_1708);
  std::__cxx11::wstring::~wstring((wstring *)(local_8c8 + 8));
  std::__cxx11::wstring::~wstring((wstring *)local_1728);
  std::__cxx11::wstring::~wstring((wstring *)(local_12f0 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&local_1748);
  std::__cxx11::wstring::~wstring((wstring *)(local_12c8 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&b);
  std::__cxx11::wstring::~wstring((wstring *)(local_12a0 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&a);
  std::__cxx11::wstring::~wstring((wstring *)(local_1278 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&texts_textmode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&texts_textmode,L"diff_main: Simple case #3.",
             (allocator<wchar_t> *)&local_1748);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&a,L"ax\t",(allocator<wchar_t> *)local_1728);
  b._M_dataplus._M_p = (pointer)&b.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&b,L"ڀx",L"");
  pwVar5 = (wstring *)&texts_linemode;
  diff_match_patch::diff_main(pwVar5,(wstring *)this,SUB81(&a,0));
  assertEquals((diff_match_patch_test *)pwVar5,(wstring *)&texts_textmode,&diffs,
               (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::__cxx11::wstring::~wstring((wstring *)&b);
  std::__cxx11::wstring::~wstring((wstring *)&a);
  std::__cxx11::wstring::~wstring((wstring *)&texts_textmode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&texts_textmode,L"1",&local_1793);
  Diff::Diff((Diff *)local_1318,Delete,(wstring *)&texts_textmode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&a,L"a",&local_1794);
  Diff::Diff((Diff *)local_1340,Equal,(wstring *)&a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&b,L"y",&local_1795);
  Diff::Diff((Diff *)local_1368,Delete,(wstring *)&b);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&local_1748,L"b",&local_1796);
  Diff::Diff((Diff *)local_1390,Equal,(wstring *)&local_1748);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)local_1728,L"2",&local_1797);
  Diff::Diff((Diff *)local_9b8,Delete,(wstring *)local_1728);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1708,L"xab",&local_1798);
  Diff::Diff((Diff *)local_9e0,Insert,local_1708);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16a8,L"",&local_1799);
  Diff::Diff((Diff *)local_a08,Insert,local_16a8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16c8,L"",&local_179a);
  Diff::Diff((Diff *)local_a30,Insert,local_16c8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16e8,L"",&local_1792);
  Diff::Diff((Diff *)local_a58,Insert,local_16e8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)local_1688,L"",&local_1791);
  pdVar4 = (diff_match_patch_test *)0x1;
  Diff::Diff((Diff *)local_a80,Insert,(wstring *)local_1688);
  diffList((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode,pdVar4,(Diff *)local_1318,
           (Diff *)local_1340,(Diff *)local_1368,(Diff *)local_1390,(Diff *)local_9b8,
           (Diff *)local_9e0,(Diff *)local_a08,(Diff *)local_a30,(Diff *)local_a58,(Diff *)local_a80
          );
  std::deque<Diff,_std::allocator<Diff>_>::_M_move_assign1
            (&diffs,(deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::__cxx11::wstring::~wstring((wstring *)(local_a80 + 8));
  std::__cxx11::wstring::~wstring((wstring *)local_1688);
  std::__cxx11::wstring::~wstring((wstring *)(local_a58 + 8));
  std::__cxx11::wstring::~wstring(local_16e8);
  std::__cxx11::wstring::~wstring((wstring *)(local_a30 + 8));
  std::__cxx11::wstring::~wstring(local_16c8);
  std::__cxx11::wstring::~wstring((wstring *)(local_a08 + 8));
  std::__cxx11::wstring::~wstring(local_16a8);
  std::__cxx11::wstring::~wstring((wstring *)(local_9e0 + 8));
  std::__cxx11::wstring::~wstring(local_1708);
  std::__cxx11::wstring::~wstring((wstring *)(local_9b8 + 8));
  std::__cxx11::wstring::~wstring((wstring *)local_1728);
  std::__cxx11::wstring::~wstring((wstring *)(local_1390 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&local_1748);
  std::__cxx11::wstring::~wstring((wstring *)(local_1368 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&b);
  std::__cxx11::wstring::~wstring((wstring *)(local_1340 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&a);
  std::__cxx11::wstring::~wstring((wstring *)(local_1318 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&texts_textmode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&texts_textmode,L"diff_main: Overlap #1.",(allocator<wchar_t> *)&local_1748)
  ;
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&a,L"1ayb2",(allocator<wchar_t> *)local_1728);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&b,L"abxab",(allocator<wchar_t> *)local_1708);
  pwVar5 = (wstring *)&texts_linemode;
  diff_match_patch::diff_main(pwVar5,(wstring *)this,SUB81(&a,0));
  assertEquals((diff_match_patch_test *)pwVar5,(wstring *)&texts_textmode,&diffs,
               (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::__cxx11::wstring::~wstring((wstring *)&b);
  std::__cxx11::wstring::~wstring((wstring *)&a);
  std::__cxx11::wstring::~wstring((wstring *)&texts_textmode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&texts_textmode,L"xaxcx",&local_1793);
  Diff::Diff((Diff *)local_13b8,Insert,(wstring *)&texts_textmode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&a,L"abc",&local_1794);
  Diff::Diff((Diff *)local_13e0,Equal,(wstring *)&a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&b,L"y",&local_1795);
  Diff::Diff((Diff *)local_1408,Delete,(wstring *)&b);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&local_1748,L"",&local_1796);
  Diff::Diff((Diff *)local_1430,Insert,(wstring *)&local_1748);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)local_1728,L"",&local_1797);
  Diff::Diff((Diff *)local_aa8,Insert,(wstring *)local_1728);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1708,L"",&local_1798);
  Diff::Diff((Diff *)local_ad0,Insert,local_1708);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16a8,L"",&local_1799);
  Diff::Diff((Diff *)local_af8,Insert,local_16a8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16c8,L"",&local_179a);
  Diff::Diff((Diff *)local_b20,Insert,local_16c8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16e8,L"",&local_1792);
  Diff::Diff((Diff *)local_b48,Insert,local_16e8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)local_1688,L"",&local_1791);
  pdVar4 = (diff_match_patch_test *)0x1;
  Diff::Diff((Diff *)local_b70,Insert,(wstring *)local_1688);
  diffList((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode,pdVar4,(Diff *)local_13b8,
           (Diff *)local_13e0,(Diff *)local_1408,(Diff *)local_1430,(Diff *)local_aa8,
           (Diff *)local_ad0,(Diff *)local_af8,(Diff *)local_b20,(Diff *)local_b48,(Diff *)local_b70
          );
  std::deque<Diff,_std::allocator<Diff>_>::_M_move_assign1
            (&diffs,(deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::__cxx11::wstring::~wstring((wstring *)(local_b70 + 8));
  std::__cxx11::wstring::~wstring((wstring *)local_1688);
  std::__cxx11::wstring::~wstring((wstring *)(local_b48 + 8));
  std::__cxx11::wstring::~wstring(local_16e8);
  std::__cxx11::wstring::~wstring((wstring *)(local_b20 + 8));
  std::__cxx11::wstring::~wstring(local_16c8);
  std::__cxx11::wstring::~wstring((wstring *)(local_af8 + 8));
  std::__cxx11::wstring::~wstring(local_16a8);
  std::__cxx11::wstring::~wstring((wstring *)(local_ad0 + 8));
  std::__cxx11::wstring::~wstring(local_1708);
  std::__cxx11::wstring::~wstring((wstring *)(local_aa8 + 8));
  std::__cxx11::wstring::~wstring((wstring *)local_1728);
  std::__cxx11::wstring::~wstring((wstring *)(local_1430 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&local_1748);
  std::__cxx11::wstring::~wstring((wstring *)(local_1408 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&b);
  std::__cxx11::wstring::~wstring((wstring *)(local_13e0 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&a);
  std::__cxx11::wstring::~wstring((wstring *)(local_13b8 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&texts_textmode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&texts_textmode,L"diff_main: Overlap #2.",(allocator<wchar_t> *)&local_1748)
  ;
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&a,L"abcy",(allocator<wchar_t> *)local_1728);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&b,L"xaxcxabc",(allocator<wchar_t> *)local_1708);
  pwVar5 = (wstring *)&texts_linemode;
  diff_match_patch::diff_main(pwVar5,(wstring *)this,SUB81(&a,0));
  assertEquals((diff_match_patch_test *)pwVar5,(wstring *)&texts_textmode,&diffs,
               (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::__cxx11::wstring::~wstring((wstring *)&b);
  std::__cxx11::wstring::~wstring((wstring *)&a);
  std::__cxx11::wstring::~wstring((wstring *)&texts_textmode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&texts_textmode,L"ABCD",&local_1793);
  Diff::Diff((Diff *)local_1458,Delete,(wstring *)&texts_textmode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&a,L"a",&local_1794);
  Diff::Diff((Diff *)local_1480,Equal,(wstring *)&a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&b,L"=",&local_1795);
  Diff::Diff((Diff *)local_14a8,Delete,(wstring *)&b);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&local_1748,L"-",&local_1796);
  Diff::Diff((Diff *)local_14d0,Insert,(wstring *)&local_1748);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)local_1728,L"bcd",&local_1797);
  Diff::Diff((Diff *)local_b98,Equal,(wstring *)local_1728);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1708,L"=",&local_1798);
  Diff::Diff((Diff *)local_bc0,Delete,local_1708);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16a8,L"-",&local_1799);
  Diff::Diff((Diff *)local_be8,Insert,local_16a8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16c8,L"efghijklmnopqrs",&local_179a)
  ;
  Diff::Diff((Diff *)local_c10,Equal,local_16c8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16e8,L"EFGHIJKLMNOefg",&local_1792);
  Diff::Diff((Diff *)local_c38,Delete,local_16e8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)local_1688,L"",&local_1791);
  pdVar4 = (diff_match_patch_test *)0x1;
  Diff::Diff((Diff *)local_c60,Insert,(wstring *)local_1688);
  diffList((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode,pdVar4,(Diff *)local_1458,
           (Diff *)local_1480,(Diff *)local_14a8,(Diff *)local_14d0,(Diff *)local_b98,
           (Diff *)local_bc0,(Diff *)local_be8,(Diff *)local_c10,(Diff *)local_c38,(Diff *)local_c60
          );
  std::deque<Diff,_std::allocator<Diff>_>::_M_move_assign1
            (&diffs,(deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::__cxx11::wstring::~wstring((wstring *)(local_c60 + 8));
  std::__cxx11::wstring::~wstring((wstring *)local_1688);
  std::__cxx11::wstring::~wstring((wstring *)(local_c38 + 8));
  std::__cxx11::wstring::~wstring(local_16e8);
  std::__cxx11::wstring::~wstring((wstring *)(local_c10 + 8));
  std::__cxx11::wstring::~wstring(local_16c8);
  std::__cxx11::wstring::~wstring((wstring *)(local_be8 + 8));
  std::__cxx11::wstring::~wstring(local_16a8);
  std::__cxx11::wstring::~wstring((wstring *)(local_bc0 + 8));
  std::__cxx11::wstring::~wstring(local_1708);
  std::__cxx11::wstring::~wstring((wstring *)(local_b98 + 8));
  std::__cxx11::wstring::~wstring((wstring *)local_1728);
  std::__cxx11::wstring::~wstring((wstring *)(local_14d0 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&local_1748);
  std::__cxx11::wstring::~wstring((wstring *)(local_14a8 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&b);
  std::__cxx11::wstring::~wstring((wstring *)(local_1480 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&a);
  std::__cxx11::wstring::~wstring((wstring *)(local_1458 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&texts_textmode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&texts_textmode,L"diff_main: Overlap #3.",(allocator<wchar_t> *)&local_1748)
  ;
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&a,L"ABCDa=bcd=efghijklmnopqrsEFGHIJKLMNOefg",
             (allocator<wchar_t> *)local_1728);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&b,L"a-bcd-efghijklmnopqrs",(allocator<wchar_t> *)local_1708);
  pwVar5 = (wstring *)&texts_linemode;
  diff_match_patch::diff_main(pwVar5,(wstring *)this,SUB81(&a,0));
  assertEquals((diff_match_patch_test *)pwVar5,(wstring *)&texts_textmode,&diffs,
               (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::__cxx11::wstring::~wstring((wstring *)&b);
  std::__cxx11::wstring::~wstring((wstring *)&a);
  std::__cxx11::wstring::~wstring((wstring *)&texts_textmode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&texts_textmode,L" ",&local_1793);
  Diff::Diff((Diff *)local_14f8,Insert,(wstring *)&texts_textmode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&a,L"a",&local_1794);
  Diff::Diff((Diff *)local_1520,Equal,(wstring *)&a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&b,L"nd",&local_1795);
  Diff::Diff((Diff *)local_1548,Insert,(wstring *)&b);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_1748,L" [[Pennsylvania]]",&local_1796);
  Diff::Diff((Diff *)local_1570,Equal,(wstring *)&local_1748);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)local_1728,L" and [[New",&local_1797);
  Diff::Diff((Diff *)local_c88,Delete,(wstring *)local_1728);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1708,L"",&local_1798);
  Diff::Diff((Diff *)local_cb0,Insert,local_1708);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16a8,L"",&local_1799);
  Diff::Diff((Diff *)local_cd8,Insert,local_16a8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16c8,L"",&local_179a);
  Diff::Diff((Diff *)local_d00,Insert,local_16c8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16e8,L"",&local_1792);
  Diff::Diff((Diff *)local_d28,Insert,local_16e8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)local_1688,L"",&local_1791);
  pdVar4 = (diff_match_patch_test *)0x1;
  Diff::Diff((Diff *)local_d50,Insert,(wstring *)local_1688);
  diffList((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode,pdVar4,(Diff *)local_14f8,
           (Diff *)local_1520,(Diff *)local_1548,(Diff *)local_1570,(Diff *)local_c88,
           (Diff *)local_cb0,(Diff *)local_cd8,(Diff *)local_d00,(Diff *)local_d28,(Diff *)local_d50
          );
  std::deque<Diff,_std::allocator<Diff>_>::_M_move_assign1
            (&diffs,(deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::__cxx11::wstring::~wstring((wstring *)(local_d50 + 8));
  std::__cxx11::wstring::~wstring((wstring *)local_1688);
  std::__cxx11::wstring::~wstring((wstring *)(local_d28 + 8));
  std::__cxx11::wstring::~wstring(local_16e8);
  std::__cxx11::wstring::~wstring((wstring *)(local_d00 + 8));
  std::__cxx11::wstring::~wstring(local_16c8);
  std::__cxx11::wstring::~wstring((wstring *)(local_cd8 + 8));
  std::__cxx11::wstring::~wstring(local_16a8);
  std::__cxx11::wstring::~wstring((wstring *)(local_cb0 + 8));
  std::__cxx11::wstring::~wstring(local_1708);
  std::__cxx11::wstring::~wstring((wstring *)(local_c88 + 8));
  std::__cxx11::wstring::~wstring((wstring *)local_1728);
  std::__cxx11::wstring::~wstring((wstring *)(local_1570 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&local_1748);
  std::__cxx11::wstring::~wstring((wstring *)(local_1548 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&b);
  std::__cxx11::wstring::~wstring((wstring *)(local_1520 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&a);
  std::__cxx11::wstring::~wstring((wstring *)(local_14f8 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&texts_textmode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&texts_textmode,L"diff_main: Large equality.",
             (allocator<wchar_t> *)&local_1748);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&a,L"a [[Pennsylvania]] and [[New",(allocator<wchar_t> *)local_1728);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&b,L" and [[Pennsylvania]]",(allocator<wchar_t> *)local_1708);
  pwVar5 = (wstring *)&texts_linemode;
  diff_match_patch::diff_main(pwVar5,(wstring *)this,SUB81(&a,0));
  assertEquals((diff_match_patch_test *)pwVar5,(wstring *)&texts_textmode,&diffs,
               (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::__cxx11::wstring::~wstring((wstring *)&b);
  std::__cxx11::wstring::~wstring((wstring *)&a);
  std::__cxx11::wstring::~wstring((wstring *)&texts_textmode);
  *(undefined4 *)this = 0x3dcccccd;
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&a,
             L"`Twas brillig, and the slithy toves\nDid gyre and gimble in the wabe:\nAll mimsy were the borogoves,\nAnd the mome raths outgrabe.\n"
             ,(allocator<wchar_t> *)&texts_linemode);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&b,
             L"I am the very model of a modern major general,\nI\'ve information vegetable, animal, and mineral,\nI know the kings of England, and I quote the fights historical,\nFrom Marathon to Waterloo, in order categorical.\n"
             ,(allocator<wchar_t> *)&texts_linemode);
  iVar3 = 10;
  while (bVar6 = iVar3 != 0, iVar3 = iVar3 + -1, bVar6) {
    std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   &texts_linemode,&a,&a);
    std::__cxx11::wstring::operator=((wstring *)&a,(wstring *)&texts_linemode);
    std::__cxx11::wstring::~wstring((wstring *)&texts_linemode);
    std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   &texts_linemode,&b,&b);
    std::__cxx11::wstring::operator=((wstring *)&b,(wstring *)&texts_linemode);
    std::__cxx11::wstring::~wstring((wstring *)&texts_linemode);
  }
  cVar1 = clock();
  diff_match_patch::diff_main((wstring *)&local_80,(wstring *)this);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_80);
  cVar2 = clock();
  pwVar5 = (wstring *)&texts_linemode;
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            (pwVar5,L"diff_main: Timeout min.",(allocator<wchar_t> *)&texts_textmode);
  assertTrue((diff_match_patch_test *)pwVar5,(wstring *)&texts_linemode,
             *(float *)this * 1e+06 <= (float)(cVar2 - cVar1));
  std::__cxx11::wstring::~wstring((wstring *)&texts_linemode);
  pwVar5 = (wstring *)&texts_linemode;
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            (pwVar5,L"diff_main: Timeout max.",(allocator<wchar_t> *)&texts_textmode);
  assertTrue((diff_match_patch_test *)pwVar5,(wstring *)&texts_linemode,
             (float)(cVar2 - cVar1) < *(float *)this * 1e+06 + *(float *)this * 1e+06);
  std::__cxx11::wstring::~wstring((wstring *)&texts_linemode);
  *(undefined4 *)this = 0;
  std::__cxx11::wstring::assign((wchar_t *)&a);
  std::__cxx11::wstring::assign((wchar_t *)&b);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_1748,L"diff_main: Simple line-mode.",(allocator<wchar_t> *)local_1728
            );
  diff_match_patch::diff_main((wstring *)&texts_linemode,(wstring *)this,SUB81(&a,0));
  pwVar5 = (wstring *)&texts_textmode;
  diff_match_patch::diff_main(pwVar5,(wstring *)this,SUB81(&a,0));
  assertEquals((diff_match_patch_test *)pwVar5,&local_1748,
               (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode,
               (deque<Diff,_std::allocator<Diff>_> *)&texts_textmode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_textmode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::__cxx11::wstring::~wstring((wstring *)&local_1748);
  std::__cxx11::wstring::assign((wchar_t *)&a);
  std::__cxx11::wstring::assign((wchar_t *)&b);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_1748,L"diff_main: Single line-mode.",(allocator<wchar_t> *)local_1728
            );
  diff_match_patch::diff_main((wstring *)&texts_linemode,(wstring *)this,SUB81(&a,0));
  pwVar5 = (wstring *)&texts_textmode;
  diff_match_patch::diff_main(pwVar5,(wstring *)this,SUB81(&a,0));
  assertEquals((diff_match_patch_test *)pwVar5,&local_1748,
               (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode,
               (deque<Diff,_std::allocator<Diff>_> *)&texts_textmode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_textmode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::__cxx11::wstring::~wstring((wstring *)&local_1748);
  std::__cxx11::wstring::assign((wchar_t *)&a);
  std::__cxx11::wstring::assign((wchar_t *)&b);
  pdVar4 = this;
  diff_match_patch::diff_main((wstring *)&local_d0,(wstring *)this,SUB81(&a,0));
  diff_rebuildtexts_abi_cxx11_(&texts_linemode,pdVar4,&local_d0);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_d0);
  diff_match_patch::diff_main((wstring *)&local_120,(wstring *)this,SUB81(&a,0));
  diff_rebuildtexts_abi_cxx11_(&texts_textmode,this,&local_120);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_120);
  this_00 = &local_1748;
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)this_00,L"diff_main: Overlap line-mode.",(allocator<wchar_t> *)local_1728);
  assertEquals((diff_match_patch_test *)this_00,&local_1748,&texts_textmode,&texts_linemode);
  std::__cxx11::wstring::~wstring((wstring *)&local_1748);
  std::
  deque<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~deque(&texts_textmode);
  std::
  deque<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~deque(&texts_linemode);
  std::__cxx11::wstring::~wstring((wstring *)&b);
  std::__cxx11::wstring::~wstring((wstring *)&a);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&diffs);
  return;
}

Assistant:

void diff_match_patch_test::testDiffMain() {
  // Perform a trivial diff.
  std::deque<Diff> diffs = diffList();
  assertEquals(L"diff_main: Null case.", diffs, dmp.diff_main(L"", L"", false));

  diffs = diffList(Diff(Diff::Operation::Equal, L"abc"));
  assertEquals(L"diff_main: Equality.", diffs, dmp.diff_main(L"abc", L"abc", false));

  diffs = diffList(Diff(Diff::Operation::Equal, L"ab"), Diff(Diff::Operation::Insert, L"123"), Diff(Diff::Operation::Equal, L"c"));
  assertEquals(L"diff_main: Simple insertion.", diffs, dmp.diff_main(L"abc", L"ab123c", false));

  diffs = diffList(Diff(Diff::Operation::Equal, L"a"), Diff(Diff::Operation::Delete, L"123"), Diff(Diff::Operation::Equal, L"bc"));
  assertEquals(L"diff_main: Simple deletion.", diffs, dmp.diff_main(L"a123bc", L"abc", false));

  diffs = diffList(Diff(Diff::Operation::Equal, L"a"), Diff(Diff::Operation::Insert, L"123"), Diff(Diff::Operation::Equal, L"b"), Diff(Diff::Operation::Insert, L"456"), Diff(Diff::Operation::Equal, L"c"));
  assertEquals(L"diff_main: Two insertions.", diffs, dmp.diff_main(L"abc", L"a123b456c", false));

  diffs = diffList(Diff(Diff::Operation::Equal, L"a"), Diff(Diff::Operation::Delete, L"123"), Diff(Diff::Operation::Equal, L"b"), Diff(Diff::Operation::Delete, L"456"), Diff(Diff::Operation::Equal, L"c"));
  assertEquals(L"diff_main: Two deletions.", diffs, dmp.diff_main(L"a123b456c", L"abc", false));

  // Perform a real diff.
  // Switch off the timeout.
  dmp.Diff_Timeout = 0;
  diffs = diffList(Diff(Diff::Operation::Delete, L"a"), Diff(Diff::Operation::Insert, L"b"));
  assertEquals(L"diff_main: Simple case #1.", diffs, dmp.diff_main(L"a", L"b", false));

  diffs = diffList(Diff(Diff::Operation::Delete, L"Apple"), Diff(Diff::Operation::Insert, L"Banana"), Diff(Diff::Operation::Equal, L"s are a"), Diff(Diff::Operation::Insert, L"lso"), Diff(Diff::Operation::Equal, L" fruit."));
  assertEquals(L"diff_main: Simple case #2.", diffs, dmp.diff_main(L"Apples are a fruit.", L"Bananas are also fruit.", false));

  diffs = diffList(Diff(Diff::Operation::Delete, L"a"), Diff(Diff::Operation::Insert, std::wstring(L"\u0680", 1)), Diff(Diff::Operation::Equal, L"x"), Diff(Diff::Operation::Delete, L"\t"), Diff(Diff::Operation::Insert, std::wstring(L"\000", 1)));
  assertEquals(L"diff_main: Simple case #3.", diffs, dmp.diff_main(L"ax\t", std::wstring(L"\u0680x\000", 3), false));

  diffs = diffList(Diff(Diff::Operation::Delete, L"1"), Diff(Diff::Operation::Equal, L"a"), Diff(Diff::Operation::Delete, L"y"), Diff(Diff::Operation::Equal, L"b"), Diff(Diff::Operation::Delete, L"2"), Diff(Diff::Operation::Insert, L"xab"));
  assertEquals(L"diff_main: Overlap #1.", diffs, dmp.diff_main(L"1ayb2", L"abxab", false));

  diffs = diffList(Diff(Diff::Operation::Insert, L"xaxcx"), Diff(Diff::Operation::Equal, L"abc"), Diff(Diff::Operation::Delete, L"y"));
  assertEquals(L"diff_main: Overlap #2.", diffs, dmp.diff_main(L"abcy", L"xaxcxabc", false));

  diffs = diffList(Diff(Diff::Operation::Delete, L"ABCD"), Diff(Diff::Operation::Equal, L"a"), Diff(Diff::Operation::Delete, L"="), Diff(Diff::Operation::Insert, L"-"), Diff(Diff::Operation::Equal, L"bcd"), Diff(Diff::Operation::Delete, L"="), Diff(Diff::Operation::Insert, L"-"), Diff(Diff::Operation::Equal, L"efghijklmnopqrs"), Diff(Diff::Operation::Delete, L"EFGHIJKLMNOefg"));
  assertEquals(L"diff_main: Overlap #3.", diffs, dmp.diff_main(L"ABCDa=bcd=efghijklmnopqrsEFGHIJKLMNOefg", L"a-bcd-efghijklmnopqrs", false));

  diffs = diffList(Diff(Diff::Operation::Insert, L" "), Diff(Diff::Operation::Equal, L"a"), Diff(Diff::Operation::Insert, L"nd"), Diff(Diff::Operation::Equal, L" [[Pennsylvania]]"), Diff(Diff::Operation::Delete, L" and [[New"));
  assertEquals(L"diff_main: Large equality.", diffs, dmp.diff_main(L"a [[Pennsylvania]] and [[New", L" and [[Pennsylvania]]", false));

  dmp.Diff_Timeout = 0.1f;  // 100ms
  // This test may 'fail' on extremely fast computers.  If so, just increase the text lengths.
  std::wstring a = L"`Twas brillig, and the slithy toves\nDid gyre and gimble in the wabe:\nAll mimsy were the borogoves,\nAnd the mome raths outgrabe.\n";
  std::wstring b = L"I am the very model of a modern major general,\nI've information vegetable, animal, and mineral,\nI know the kings of England, and I quote the fights historical,\nFrom Marathon to Waterloo, in order categorical.\n";
  // Increase the text lengths by 1024 times to ensure a timeout.
  for (int x = 0; x < 10; x++) {
    a = a + a;
    b = b + b;
  }
  clock_t startTime = clock();
  dmp.diff_main(a, b);
  clock_t endTime = clock();
  // Test that we took at least the timeout period.
  assertTrue(L"diff_main: Timeout min.", dmp.Diff_Timeout * CLOCKS_PER_SEC <= endTime - startTime);
  // Test that we didn't take forever (be forgiving).
  // Theoretically this test could fail very occasionally if the
  // OS task swaps or locks up for a second at the wrong moment.
  // Java seems to overrun by ~80% (compared with 10% for other languages).
  // Therefore use an upper limit of 0.5s instead of 0.2s.
  assertTrue(L"diff_main: Timeout max.", dmp.Diff_Timeout * CLOCKS_PER_SEC * 2 > endTime - startTime);
  dmp.Diff_Timeout = 0;

  // Test the linemode speedup.
  // Must be long to pass the 100 char cutoff.
  a = L"1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n";
  b = L"abcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\n";
  assertEquals(L"diff_main: Simple line-mode.", dmp.diff_main(a, b, true), dmp.diff_main(a, b, false));

  a = L"1234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890";
  b = L"abcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghij";
  assertEquals(L"diff_main: Single line-mode.", dmp.diff_main(a, b, true), dmp.diff_main(a, b, false));

  a = L"1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n";
  b = L"abcdefghij\n1234567890\n1234567890\n1234567890\nabcdefghij\n1234567890\n1234567890\n1234567890\nabcdefghij\n1234567890\n1234567890\n1234567890\nabcdefghij\n";
  std::deque<std::wstring> texts_linemode = diff_rebuildtexts(dmp.diff_main(a, b, true));
  std::deque<std::wstring> texts_textmode = diff_rebuildtexts(dmp.diff_main(a, b, false));
  assertEquals(L"diff_main: Overlap line-mode.", texts_textmode, texts_linemode);
}